

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnBrTableTarget(TypeChecker *this,Index depth)

{
  _anonymous_namespace_ *this_00;
  Result RVar1;
  char *prefix;
  TypeVector *pTVar2;
  _anonymous_namespace_ *this_01;
  Label *label;
  Label *local_70;
  string local_68;
  string local_48;
  
  RVar1 = GetLabel(this,depth,&local_70);
  prefix = (char *)0x1;
  if (RVar1.enum_ != Error) {
    pTVar2 = &local_70->param_types;
    this_01 = (_anonymous_namespace_ *)&local_70->result_types;
    if (local_70->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)pTVar2;
    }
    RVar1 = CheckSignature(this,(TypeVector *)this_01,"br_table");
    prefix = (char *)CONCAT71((int7)((ulong)pTVar2 >> 8),RVar1.enum_ == Error);
    this_00 = (_anonymous_namespace_ *)this->br_table_sig_;
    if (this_00 == (_anonymous_namespace_ *)0x0) {
      this->br_table_sig_ = (TypeVector *)this_01;
    }
    else if (*(long *)(this_00 + 8) - *(long *)this_00 != *(long *)(this_01 + 8) - *(long *)this_01)
    {
      (anonymous_namespace)::TypesToString_abi_cxx11_(&local_48,this_00,(TypeVector *)0x0,prefix);
      (anonymous_namespace)::TypesToString_abi_cxx11_(&local_68,this_01,(TypeVector *)0x0,prefix);
      PrintError(this,"br_table labels have inconsistent types: expected %s, got %s",
                 local_48._M_dataplus._M_p,local_68._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      prefix = (char *)0x1;
    }
  }
  return (Result)((Enum)prefix & 0xff);
}

Assistant:

Result TypeChecker::OnBrTableTarget(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckSignature(label_sig, "br_table");

  // Make sure this label's signature is consistent with the previous labels'
  // signatures.
  if (br_table_sig_ == nullptr) {
    br_table_sig_ = &label_sig;
  } else {
    if (br_table_sig_->size() != label_sig.size()) {
      result |= Result::Error;
      PrintError("br_table labels have inconsistent types: expected %s, got %s",
                 TypesToString(*br_table_sig_).c_str(),
                 TypesToString(label_sig).c_str());
    }
  }

  return result;
}